

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

bool __thiscall
cfd::TransactionContext::VerifyInputSchnorrSignature
          (TransactionContext *this,SchnorrSignature *signature,OutPoint *outpoint,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxo_list,SchnorrPubkey *pubkey,
          ByteData *annex)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint32_t uVar6;
  undefined4 uVar7;
  const_iterator utxo_00;
  undefined8 uVar8;
  string *message;
  OutPoint *in_RDX;
  ByteData256 *in_RSI;
  long *in_RDI;
  SchnorrSignature *in_R8;
  long in_R9;
  ByteData256 sighash;
  ByteData hash;
  Script locking_script;
  UtxoData *utxo;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range2;
  bool is_find;
  OutPoint target_outpoint;
  TxIn *txin_ref;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *__range1;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxos;
  UtxoData target_utxo;
  UtxoData *in_stack_fffffffffffff818;
  UtxoData *in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff82c;
  string *in_stack_fffffffffffff830;
  undefined8 in_stack_fffffffffffff838;
  CfdError CVar10;
  allocator *paVar9;
  undefined6 in_stack_fffffffffffff840;
  undefined1 in_stack_fffffffffffff846;
  undefined1 in_stack_fffffffffffff847;
  undefined7 in_stack_fffffffffffff858;
  undefined1 in_stack_fffffffffffff85f;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *in_stack_fffffffffffff860;
  UtxoData *in_stack_fffffffffffff880;
  ByteData local_758;
  undefined1 local_73c [12];
  undefined1 local_730 [30];
  undefined1 local_712;
  allocator local_711;
  string local_710 [56];
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_6d8;
  ByteData local_6c0;
  undefined1 local_6a2;
  allocator local_6a1;
  string local_6a0 [38];
  undefined1 local_67a;
  allocator local_679;
  string local_678 [38];
  undefined1 local_652;
  allocator local_651;
  string local_650 [32];
  Script local_630;
  Txid local_5f8;
  reference local_5d8;
  UtxoData *local_5d0;
  Txid local_5b0;
  OutPoint local_590;
  reference local_568;
  TxIn *local_560;
  __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_558;
  long *local_550;
  undefined1 local_538 [104];
  Script local_4d0 [9];
  Amount local_2c8 [664];
  long local_30;
  SchnorrSignature *local_28;
  OutPoint *local_18;
  ByteData256 *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  UtxoData::UtxoData(in_stack_fffffffffffff880);
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::vector
            ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)0x3b25a9);
  std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::size
            ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)(in_RDI + 2));
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::reserve
            (in_stack_fffffffffffff860,CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858)
            );
  local_550 = in_RDI + 2;
  local_558._M_current =
       (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::begin
                         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                          in_stack_fffffffffffff818);
  local_560 = (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::end
                                ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                                 in_stack_fffffffffffff818);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
                        *)in_stack_fffffffffffff820,
                       (__normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
                        *)in_stack_fffffffffffff818);
    CVar10 = (CfdError)((ulong)in_stack_fffffffffffff838 >> 0x20);
    if (!bVar1) break;
    local_568 = __gnu_cxx::
                __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
                ::operator*(&local_558);
    cfd::core::AbstractTxIn::GetTxid();
    uVar5 = cfd::core::AbstractTxIn::GetVout();
    cfd::core::OutPoint::OutPoint(&local_590,&local_5b0,uVar5);
    core::Txid::~Txid((Txid *)0x3b268f);
    bVar1 = false;
    utxo_00 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin
                        (in_stack_fffffffffffff818);
    local_5d0 = (UtxoData *)
                std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end
                          ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                           in_stack_fffffffffffff818);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                          *)in_stack_fffffffffffff820,
                         (__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                          *)in_stack_fffffffffffff818);
      CVar10 = (CfdError)((ulong)in_stack_fffffffffffff838 >> 0x20);
      if (!bVar2) break;
      local_5d8 = __gnu_cxx::
                  __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                  ::operator*((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                               *)&stack0xfffffffffffffa38);
      cfd::core::AbstractTxIn::GetTxid();
      bVar3 = cfd::core::Txid::Equals(&local_5f8);
      bVar2 = false;
      if ((bVar3 & 1) != 0) {
        uVar6 = cfd::core::AbstractTxIn::GetVout();
        bVar2 = uVar6 == local_5d8->vout;
      }
      core::Txid::~Txid((Txid *)0x3b2789);
      if (bVar2) {
        bVar1 = true;
        GetLockingScriptFromUtxoData(utxo_00._M_current);
        std::vector<cfd::core::TxOut,std::allocator<cfd::core::TxOut>>::
        emplace_back<cfd::core::Amount_const&,cfd::core::Script&>
                  ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
                   in_stack_fffffffffffff830,
                   (Amount *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                   (Script *)in_stack_fffffffffffff820);
        bVar3 = cfd::core::OutPoint::operator==(local_18,&local_590);
        if ((bVar3 & 1) != 0) {
          UtxoData::operator=(in_stack_fffffffffffff820,in_stack_fffffffffffff818);
          cfd::core::Script::operator=(local_4d0,&local_630);
        }
        core::Script::~Script((Script *)in_stack_fffffffffffff820);
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
      ::operator++((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                    *)&stack0xfffffffffffffa38);
    }
    if (!bVar1) {
      local_652 = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      paVar9 = &local_651;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_650,"Utxo is not found. VerifyInputSchnorrSignature fail.",paVar9);
      core::CfdException::CfdException
                ((CfdException *)
                 CONCAT17(in_stack_fffffffffffff847,
                          CONCAT16(in_stack_fffffffffffff846,in_stack_fffffffffffff840)),CVar10,
                 in_stack_fffffffffffff830);
      local_652 = 0;
      __cxa_throw(uVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::OutPoint::~OutPoint((OutPoint *)0x3b29f4);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
    ::operator++(&local_558);
  }
  bVar3 = cfd::core::Amount::operator==(local_2c8,0);
  if ((bVar3 & 1) != 0) {
    local_67a = 1;
    uVar8 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_678,"OutPoint is not found into utxo_list.",&local_679);
    core::CfdException::CfdException
              ((CfdException *)
               CONCAT17(in_stack_fffffffffffff847,
                        CONCAT16(in_stack_fffffffffffff846,in_stack_fffffffffffff840)),CVar10,
               in_stack_fffffffffffff830);
    local_67a = 0;
    __cxa_throw(uVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  bVar3 = cfd::core::Script::IsTaprootScript();
  if ((bVar3 & 1) != 0) {
    cfd::core::Script::GetElementList();
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator[]
              (&local_6d8,1);
    cfd::core::ScriptElement::GetBinaryData();
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               in_stack_fffffffffffff830);
    cfd::core::SchnorrPubkey::GetData();
    bVar3 = cfd::core::ByteData::Equals(&local_6c0);
    bVar4 = bVar3 ^ 0xff;
    core::ByteData::~ByteData((ByteData *)0x3b2cb2);
    if ((bVar4 & 1) != 0) {
      local_712 = 1;
      message = (string *)__cxa_allocate_exception(0x30);
      paVar9 = &local_711;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_710,"Unmatch locking script.",paVar9);
      core::CfdException::CfdException
                ((CfdException *)CONCAT17(bVar3,CONCAT16(bVar4,in_stack_fffffffffffff840)),
                 (CfdError)((ulong)paVar9 >> 0x20),message);
      local_712 = 0;
      __cxa_throw(message,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    uVar7 = (**(code **)(*in_RDI + 0x78))(in_RDI,local_18);
    cfd::core::SchnorrSignature::GetSigHashType();
    if (local_30 == 0) {
      cfd::core::ByteData::ByteData(&local_758);
    }
    else {
      core::ByteData::ByteData
                ((ByteData *)in_stack_fffffffffffff820,(ByteData *)in_stack_fffffffffffff818);
    }
    cfd::core::Transaction::GetSchnorrSignatureHash
              (local_730,in_RDI,uVar7,local_73c,local_538,0,&local_758);
    core::ByteData::~ByteData((ByteData *)0x3b2ebb);
    bVar3 = cfd::core::SchnorrPubkey::Verify(local_28,local_10);
    core::ByteData256::~ByteData256((ByteData256 *)0x3b2eeb);
    core::ByteData::~ByteData((ByteData *)0x3b2ef8);
    std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector
              ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
               in_stack_fffffffffffff830);
    UtxoData::~UtxoData(in_stack_fffffffffffff820);
    return (bool)(bVar3 & 1);
  }
  local_6a2 = 1;
  uVar8 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a0,"Target OutPoint is not taproot.",&local_6a1);
  core::CfdException::CfdException
            ((CfdException *)
             CONCAT17(in_stack_fffffffffffff847,
                      CONCAT16(in_stack_fffffffffffff846,in_stack_fffffffffffff840)),CVar10,
             in_stack_fffffffffffff830);
  local_6a2 = 0;
  __cxa_throw(uVar8,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

bool TransactionContext::VerifyInputSchnorrSignature(
    const SchnorrSignature& signature, const OutPoint& outpoint,
    const std::vector<UtxoData>& utxo_list, const SchnorrPubkey& pubkey,
    const ByteData* annex) const {
  UtxoData target_utxo;
  std::vector<TxOut> utxos;
  utxos.reserve(vin_.size());
  for (const auto& txin_ref : vin_) {
    OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    bool is_find = false;
    for (const auto& utxo : utxo_list) {
      if (txin_ref.GetTxid().Equals(utxo.txid) &&
          (txin_ref.GetVout() == utxo.vout)) {
        is_find = true;
        Script locking_script = GetLockingScriptFromUtxoData(utxo);
        utxos.emplace_back(utxo.amount, locking_script);

        if (outpoint == target_outpoint) {
          target_utxo = utxo;
          target_utxo.locking_script = locking_script;
        }
      }
    }
    if (!is_find) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Utxo is not found. VerifyInputSchnorrSignature fail.");
    }
  }
  if (target_utxo.amount == 0) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "OutPoint is not found into utxo_list.");
  } else if (!target_utxo.locking_script.IsTaprootScript()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Target OutPoint is not taproot.");
  }
  auto hash = target_utxo.locking_script.GetElementList()[1].GetBinaryData();
  if (!hash.Equals(pubkey.GetData())) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch locking script.");
  }

  auto sighash = GetSchnorrSignatureHash(
      GetTxInIndex(outpoint), signature.GetSigHashType(), utxos, nullptr,
      (annex != nullptr) ? *annex : ByteData());
  return pubkey.Verify(signature, sighash);
}